

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

gravity_function_t *
gravity_codegen(gnode_t *node,gravity_delegate_t *delegate,gravity_vm *vm,_Bool add_debug)

{
  ircode_t *code_00;
  gravity_function_t *local_158;
  size_t local_150;
  undefined1 local_148 [8];
  gvisitor_t visitor;
  gravity_function_t *f;
  ircode_t *code;
  codegen_t data;
  _Bool add_debug_local;
  gravity_vm *vm_local;
  gravity_delegate_t *delegate_local;
  gnode_t *node_local;
  
  data.vm._7_1_ = add_debug;
  memset(&code,0,0x40);
  data.context.n = 0;
  code = (ircode_t *)0x0;
  data.context.m = 0;
  data.superfix.n = 0;
  data.context.p = (gravity_object_t **)0x0;
  data.superfix.m = 0;
  data._48_8_ = vm;
  code_00 = ircode_create(0);
  visitor.visit_postfix_expr =
       (_func_void_gvisitor_ptr_gnode_postfix_expr_t_ptr *)
       gravity_function_new(vm,"$moduleinit",0,0,0,code_00);
  if (code == (ircode_t *)data.context.n) {
    if (data.context.n == 0) {
      local_150 = 8;
    }
    else {
      local_150 = data.context.n << 1;
    }
    data.context.n = local_150;
    data.context.m = (size_t)realloc((void *)data.context.m,local_150 << 3);
  }
  *(_func_void_gvisitor_ptr_gnode_postfix_expr_t_ptr **)(data.context.m + (long)code * 8) =
       visitor.visit_postfix_expr;
  local_148._0_4_ = 0;
  visitor._0_8_ = &code;
  visitor.data._0_1_ = data.vm._7_1_ & 1;
  visitor.delegate = (void *)0x0;
  visitor.visit_pre = (_func_void_gvisitor_ptr_gnode_t_ptr *)0x0;
  visitor.visit_post = visit_list_stmt;
  visitor.visit_list_stmt = visit_compound_stmt;
  visitor.visit_compound_stmt = visit_label_stmt;
  visitor.visit_label_stmt = visit_flow_stmt;
  visitor.visit_flow_stmt = visit_jump_stmt;
  visitor.visit_jump_stmt = visit_loop_stmt;
  visitor.visit_loop_stmt = visit_empty_stmt;
  visitor.visit_empty_stmt = visit_function_decl;
  visitor.visit_function_decl = visit_variable_decl;
  visitor.visit_variable_decl = visit_enum_decl;
  visitor.visit_enum_decl = visit_class_decl;
  visitor.visit_class_decl = visit_module_decl;
  visitor.visit_module_decl = visit_binary_expr;
  visitor.visit_binary_expr = visit_unary_expr;
  visitor.visit_unary_expr = visit_file_expr;
  visitor.visit_file_expr = visit_literal_expr;
  visitor.visit_literal_expr = visit_identifier_expr;
  visitor.visit_identifier_expr = visit_keyword_expr;
  visitor.visit_keyword_expr = visit_list_expr;
  visitor.visit_list_expr = visit_postfix_expr;
  visitor._16_8_ = delegate;
  code = (ircode_t *)((long)&code->list + 1);
  gvisit((gvisitor_t *)local_148,node);
  if (data.context.p != (gravity_object_t **)0x0) {
    fix_superclasses((gvisitor_t *)local_148);
  }
  code = (ircode_t *)((long)&code[-1].context.p + 7);
  if (code == (ircode_t *)0x0) {
    if (data.context.m != 0) {
      free((void *)data.context.m);
    }
    if (local_148._0_4_ != 0) {
      ircode_free(code_00);
      *(undefined8 *)(visitor.visit_postfix_expr + 0xa0) = 0;
    }
    if (local_148._0_4_ == 0) {
      local_158 = (gravity_function_t *)visitor.visit_postfix_expr;
    }
    else {
      local_158 = (gravity_function_t *)0x0;
    }
    return local_158;
  }
  __assert_fail("marray_size(data.context) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                ,0x85f,
                "gravity_function_t *gravity_codegen(gnode_t *, gravity_delegate_t *, gravity_vm *, _Bool)"
               );
}

Assistant:

gravity_function_t *gravity_codegen(gnode_t *node, gravity_delegate_t *delegate, gravity_vm *vm, bool add_debug) {
    codegen_t data = {.vm = vm, .lasterror = 0};
    marray_init(data.context);
    marray_init(data.superfix);

    ircode_t *code = ircode_create(0);
    gravity_function_t *f = gravity_function_new(vm, INITMODULE_NAME, 0, 0, 0, code);
    marray_push(gravity_object_t*, data.context, (gravity_object_t *)f);

    gvisitor_t visitor = {
        .nerr = 0,                      // used for internal codegen errors
        .data = &data,                  // used to store a pointer to codegen struct
        .bflag = add_debug,             // flag used to decide if bytecode must include debug info
        .delegate = (void *)delegate,   // compiler delegate to report errors

        // COMMON
        .visit_pre = NULL,
        .visit_post = NULL,

        // STATEMENTS: 7
        .visit_list_stmt = visit_list_stmt,
        .visit_compound_stmt = visit_compound_stmt,
        .visit_label_stmt = visit_label_stmt,
        .visit_flow_stmt = visit_flow_stmt,
        .visit_loop_stmt = visit_loop_stmt,
        .visit_jump_stmt = visit_jump_stmt,
        .visit_empty_stmt = visit_empty_stmt,

        // DECLARATIONS: 5
        .visit_function_decl = visit_function_decl,
        .visit_variable_decl = visit_variable_decl,
        .visit_enum_decl = visit_enum_decl,
        .visit_class_decl = visit_class_decl,
        .visit_module_decl = visit_module_decl,

        // EXPRESSIONS: 8
        .visit_binary_expr = visit_binary_expr,
        .visit_unary_expr = visit_unary_expr,
        .visit_file_expr = visit_file_expr,
        .visit_literal_expr = visit_literal_expr,
        .visit_identifier_expr = visit_identifier_expr,
        .visit_keyword_expr = visit_keyword_expr,
        .visit_list_expr = visit_list_expr,
        .visit_postfix_expr = visit_postfix_expr,
    };

    DEBUG_CODEGEN("=== BEGIN CODEGEN ===");
    gvisit(&visitor, node);
    DEBUG_CODEGEN("\n");

    // check for special superfix
    if (marray_size(data.superfix)) {
        fix_superclasses(&visitor);
    }

    // pop globals instance init special function
    marray_pop(data.context);
    assert(marray_size(data.context) == 0);
    marray_destroy(data.context);

    // in case of codegen errors explicity free code and return NULL
    if (visitor.nerr != 0) {ircode_free(code); f->bytecode = NULL;}
    return (visitor.nerr == 0) ? f : NULL;
}